

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O3

void __thiscall PeleLM::initDataOtherTypes(PeleLM *this)

{
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> _Var1;
  pointer pSVar2;
  TimeCenter TVar3;
  Real time;
  
  _Var1.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (this->super_NavierStokesBase).super_AmrLevel.state.
       super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
       super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
       super__Vector_impl_data._M_start[RhoYdot_Type].new_data._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            ((FabArray<amrex::FArrayBox> *)
             _Var1.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0.0,0,
             *(int *)((long)_Var1.
                            super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                            .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xcc),
             (IntVect *)
             ((long)_Var1.
                    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                    .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0));
  _Var1.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (this->super_NavierStokesBase).super_AmrLevel.state.
       super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
       super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
       super__Vector_impl_data._M_start[FuncCount_Type].new_data._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            ((FabArray<amrex::FArrayBox> *)
             _Var1.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,1.0,0,
             *(int *)((long)_Var1.
                            super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                            .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xcc),
             (IntVect *)
             ((long)_Var1.
                    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                    .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0));
  pSVar2 = (this->super_NavierStokesBase).super_AmrLevel.state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  TVar3 = amrex::StateDescriptor::timeType(pSVar2->desc);
  if (TVar3 == Point) {
    time = (pSVar2->new_time).stop;
  }
  else {
    time = ((pSVar2->new_time).start + (pSVar2->new_time).stop) * 0.5;
  }
  setThermoPress(this,time);
  return;
}

Assistant:

void
PeleLM::initDataOtherTypes ()
{
  // Set initial omegadot = 0
  get_new_data(RhoYdot_Type).setVal(0.0);

  // Put something reasonable into the FuncCount variable
  get_new_data(FuncCount_Type).setVal(1);

  // Fill the thermodynamic pressure into the state
  setThermoPress(state[State_Type].curTime());
}